

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  supertype *psVar1;
  bool bVar2;
  fd_set *pfVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  path_node_type *ppVar7;
  undefined7 extraout_var;
  pointer ptVar8;
  uint uVar9;
  _func_int **i;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
  *this_00;
  long lVar10;
  uint in_stack_00000008;
  error_code ec;
  value_type r;
  error_code ec_1;
  undefined4 uVar11;
  undefined1 local_98 [24];
  pointer local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_78;
  long local_70;
  undefined1 local_68 [28];
  undefined4 uStack_4c;
  undefined8 local_48;
  long local_40;
  byte local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  pfVar3 = __exceptfds;
  while (uVar9 = (byte)pfVar3->fds_bits[0] & 0xf, uVar9 - 8 < 2) {
    pfVar3 = (fd_set *)pfVar3->fds_bits[1];
  }
  if (uVar9 == 0xe) {
    pp_Var4 = (_func_int **)
              basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
    if (pp_Var4 != (_func_int **)0x0) {
      uVar5 = std::_V2::system_category();
      i = (_func_int **)0x0;
      do {
        local_68._24_4_ = 0;
        local_48 = uVar5;
        pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            __exceptfds,(size_t)i);
        uVar11 = (undefined4)((ulong)(local_68 + 0x18) >> 0x20);
        token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)local_98,
                   (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)&this->expr_,(reference)this_00,(reference)__readfds,(result_options)pbVar6,
                   (error_code *)(ulong)in_stack_00000008);
        if ((local_68._24_4_ == 0) &&
           (bVar2 = is_false<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               local_98), !bVar2)) {
          ppVar7 = (path_node_type *)__writefds;
          local_68._0_8_ = i;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_98._16_8_ = __writefds;
            ppVar7 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                               (this_00,(basic_path_node<char> **)(local_98 + 0x10),
                                (unsigned_long *)local_68);
          }
          pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              __exceptfds,(size_t)i);
          psVar1 = (this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ).tail_;
          if (psVar1 == (supertype *)0x0) {
            (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar7,pbVar6);
          }
          else {
            (*psVar1->_vptr_jsonpath_selector[2])
                      (psVar1,this_00,__readfds,ppVar7,pbVar6,__timeout,
                       CONCAT44(uVar11,in_stack_00000008));
          }
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_98);
        i = (_func_int **)((long)i + 1);
        pp_Var4 = (_func_int **)
                  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
      } while (i < pp_Var4);
    }
  }
  else {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    pp_Var4 = (_func_int **)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((object_range_type *)(local_68 + 0x18),
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)__exceptfds);
      local_70 = local_40;
      bVar2 = (byte)local_48 == local_38;
      if (((byte)local_48 & local_38 & 1) != 0) {
        bVar2 = CONCAT44(uStack_4c,local_68._24_4_) == local_40;
      }
      pp_Var4 = (_func_int **)(ulong)bVar2;
      if (bVar2 == false) {
        local_78 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)&this->expr_;
        ptVar8 = (pointer)std::_V2::system_category();
        lVar10 = CONCAT44(uStack_4c,local_68._24_4_) + 0x20;
        do {
          local_98._0_4_ = 0;
          uVar11 = (undefined4)((ulong)local_98 >> 0x20);
          local_98._8_8_ = ptVar8;
          token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      *)local_68,local_78,(reference)this_00,(reference)__readfds,
                     (result_options)lVar10,(error_code *)(ulong)in_stack_00000008);
          if ((local_98._0_4_ == 0) &&
             (bVar2 = is_false<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *
                                 )local_68), !bVar2)) {
            local_80 = *(pointer *)(lVar10 + -0x20);
            local_98._16_8_ = *(undefined8 *)(lVar10 + -0x18);
            ppVar7 = (path_node_type *)__writefds;
            if ((in_stack_00000008 & 0xb) != 0) {
              local_68._16_8_ = __writefds;
              ppVar7 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                       ::
                       create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,std::basic_string_view<char,std::char_traits<char>>const&>
                                 (this_00,(basic_path_node<char> **)(local_68 + 0x10),
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  (local_98 + 0x10));
            }
            psVar1 = (this->
                     super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     ).tail_;
            if (psVar1 == (supertype *)0x0) {
              (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar7,lVar10);
            }
            else {
              (*psVar1->_vptr_jsonpath_selector[2])
                        (psVar1,this_00,__readfds,ppVar7,lVar10,__timeout,
                         CONCAT44(uVar11,in_stack_00000008));
            }
          }
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_68);
          pp_Var4 = (_func_int **)(ulong)((byte)local_48 == local_38);
          bVar2 = lVar10 + 0x10 == local_70;
          if (((byte)local_48 & local_38 & 1) == 0) {
            bVar2 = (byte)local_48 == local_38;
          }
          lVar10 = lVar10 + 0x30;
        } while (!bVar2);
      }
    }
  }
  return (int)pp_Var4;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, current[i], options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current[i], receiver, options);
                    }
                }
            }
            else if (current.is_object())
            {
                for (auto& member : current.object_range())
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, member.value(), options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, member.key(), options), 
                                            member.value(), receiver, options);
                    }
                }
            }
        }